

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::write_float<char,fmt::v10::appender,long_double>
                   (appender out,longdouble value,format_specs<char> specs,locale_ref loc)

{
  long lVar1;
  unkbyte10 Var2;
  undefined2 uVar3;
  char cVar4;
  int iVar5;
  float_specs fVar6;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar7;
  appender it;
  int precision;
  appender out_00;
  float_specs *in_R9;
  bool bVar8;
  longdouble lVar9;
  format_specs<char> specs_00;
  float_specs fspecs;
  big_decimal_fp f;
  float_specs local_290;
  format_specs<char> local_288;
  longdouble local_274;
  undefined1 local_268 [24];
  big_decimal_fp local_250;
  buffer<char> local_240;
  char local_220 [504];
  
  local_288._8_8_ = specs._8_8_;
  local_288._0_8_ = specs._0_8_;
  local_274 = value;
  local_268._0_10_ = value;
  Var2 = local_268._0_10_;
  local_268._8_2_ = (undefined2)((unkuint10)value >> 0x40);
  uVar3 = local_268._8_2_;
  local_268._0_10_ = Var2;
  fVar6 = parse_float_type_spec<fmt::v10::detail::error_handler,char>
                    (&local_288,(error_handler *)&local_240);
  local_290._6_2_ = fVar6._6_2_;
  local_290._0_5_ = fVar6._0_5_;
  local_290._5_1_ = (char)((((ushort)local_288._9_2_ & 0x70) << 4) >> 8);
  if ((short)uVar3 < 0) {
    local_290 = (float_specs)((ulong)fVar6 & 0xffff00ffffffffff | 0x10000000000);
    lVar9 = -local_274;
  }
  else {
    lVar9 = local_274;
    if (((ushort)local_288._9_2_ & 0x70) == 0x10) {
      local_290 = (float_specs)((ulong)fVar6 & 0xffff00ffffffffff);
    }
  }
  if (lVar9 == (longdouble)INFINITY) {
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._1_7_ = 0;
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_1_ = NAN(lVar9);
    specs_00._8_8_ = &local_290;
    specs_00._0_8_ = local_288._8_8_;
    bVar7.container =
         (buffer<char> *)
         write_nonfinite<char,fmt::v10::appender>
                   (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,out_00
                    ,local_288.width._0_1_,specs_00,in_R9);
  }
  else {
    local_274 = lVar9;
    if (((local_288._9_2_ & 0xf) == 4) && (((ulong)local_290 & 0xff0000000000) != 0)) {
      cVar4 = ""[(uint)local_290._4_4_ >> 8 & 0xff];
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                    + 0x18) <
          *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                   + 0x10) + 1U) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      }
      lVar1 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 0x10);
      *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
               0x10) = lVar1 + 1;
      *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 8) + lVar1) = cVar4;
      local_290._5_1_ = 0;
      if (local_288.width != 0) {
        local_288.width = local_288.width + -1;
      }
    }
    local_240.size_ = 0;
    local_240._vptr_buffer = (_func_int **)&PTR_grow_0013b950;
    local_240.capacity_ = 500;
    cVar4 = local_290._4_1_;
    local_240.ptr_ = local_220;
    if (cVar4 == '\x03') {
      bVar8 = ((ulong)local_290 & 0xff0000000000) != 0;
      if (bVar8) {
        local_220[0] = ""[(uint)local_290._4_4_ >> 8 & 0xff];
      }
      local_240.size_ = (size_t)bVar8;
      local_240.capacity_ = 500;
      local_240._vptr_buffer = (_func_int **)&PTR_grow_0013b950;
      format_hexfloat<long_double,_0>(local_274,local_288.precision,local_290,&local_240);
      local_250.significand = local_240.ptr_;
      local_250.significand_size = (undefined4)local_240.size_;
      local_250.exponent = local_240.size_._4_4_;
      bVar7.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_bytes<(fmt::v10::align::type)2,char,fmt::v10::appender>(fmt::v10::appender,fmt::v10::basic_string_view<char>,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_&>
                     (out,&local_288,local_240.size_,local_240.size_,
                      (anon_class_16_1_a7b7af8b *)&local_250);
    }
    else {
      precision = 6;
      if (local_288.type == none) {
        precision = local_288.precision;
      }
      if (-1 < (long)local_288._0_8_) {
        precision = local_288.precision;
      }
      if (cVar4 == '\x01') {
        if (precision == 0x7fffffff) {
          throw_format_error("number is too big");
        }
        precision = precision + 1;
      }
      else {
        iVar5 = 1;
        if (precision != 0) {
          iVar5 = precision;
        }
        if (cVar4 != '\x02') {
          precision = iVar5;
        }
      }
      iVar5 = format_float<long_double>(local_274,precision,local_290,&local_240);
      local_290.precision = precision;
      local_250.significand = local_240.ptr_;
      local_250._8_8_ = CONCAT44(iVar5,(int)local_240.size_);
      bVar7.container =
           (buffer<char> *)
           do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>
                     (out,&local_250,&local_288,local_290,loc);
    }
    if (local_240.ptr_ != local_220) {
      operator_delete(local_240.ptr_);
    }
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar7.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value,
                                 format_specs<Char> specs, locale_ref loc)
    -> OutputIt {
  float_specs fspecs = parse_float_type_spec(specs);
  fspecs.sign = specs.sign;
  if (detail::signbit(value)) {  // value < 0 is false for NaN so use signbit.
    fspecs.sign = sign::minus;
    value = -value;
  } else if (fspecs.sign == sign::minus) {
    fspecs.sign = sign::none;
  }

  if (!detail::isfinite(value))
    return write_nonfinite(out, detail::isnan(value), specs, fspecs);

  if (specs.align == align::numeric && fspecs.sign) {
    auto it = reserve(out, 1);
    *it++ = detail::sign<Char>(fspecs.sign);
    out = base_iterator(out, it);
    fspecs.sign = sign::none;
    if (specs.width != 0) --specs.width;
  }

  memory_buffer buffer;
  if (fspecs.format == float_format::hex) {
    if (fspecs.sign) buffer.push_back(detail::sign<char>(fspecs.sign));
    format_hexfloat(convert_float(value), specs.precision, fspecs, buffer);
    return write_bytes<align::right>(out, {buffer.data(), buffer.size()},
                                     specs);
  }
  int precision = specs.precision >= 0 || specs.type == presentation_type::none
                      ? specs.precision
                      : 6;
  if (fspecs.format == float_format::exp) {
    if (precision == max_value<int>())
      throw_format_error("number is too big");
    else
      ++precision;
  } else if (fspecs.format != float_format::fixed && precision == 0) {
    precision = 1;
  }
  if (const_check(std::is_same<T, float>())) fspecs.binary32 = true;
  int exp = format_float(convert_float(value), precision, fspecs, buffer);
  fspecs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float(out, f, specs, fspecs, loc);
}